

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftedMieBondType.hpp
# Opt level: O0

void __thiscall
OpenMD::ShiftedMieBondType::calcForce
          (ShiftedMieBondType *this,RealType r,RealType *V,RealType *dVdr)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  __type _Var2;
  __type _Var3;
  RealType rim1;
  RealType rin1;
  RealType rim;
  RealType rin;
  RealType ri;
  RealType ros;
  int __y;
  double in_stack_ffffffffffffffb0;
  
  dVar1 = 1.0 / (in_XMM0_Qa / *(double *)(in_RDI + 0x10));
  __y = (int)((ulong)in_RDI >> 0x20);
  _Var2 = std::pow<double,int>(in_stack_ffffffffffffffb0,__y);
  _Var3 = std::pow<double,int>(in_stack_ffffffffffffffb0,__y);
  *in_RSI = *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x18) * (_Var2 - _Var3) +
            -*(double *)(in_RDI + 0x38);
  *in_RDX = (*(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x18) *
            ((double)-*(int *)(in_RDI + 0x20) * _Var2 * dVar1 +
            (double)*(int *)(in_RDI + 0x24) * _Var3 * dVar1)) / *(double *)(in_RDI + 0x10);
  return;
}

Assistant:

virtual void calcForce(RealType r, RealType& V, RealType& dVdr) {
      RealType ros, ri, rin, rim, rin1, rim1;

      ros  = r / sigma;
      ri   = 1.0 / ros;
      rin  = pow(ri, n);
      rim  = pow(ri, m);
      rin1 = rin * ri;
      rim1 = rim * ri;

      V    = nmScale_ * epsilon * (rin - rim) - potS_;
      dVdr = nmScale_ * epsilon * (-n * rin1 + m * rim1) / sigma;
    }